

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  iterator iter;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_50;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_38;
  
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase._vptr_MapFieldBase = (_func_int **)&PTR__DynamicMapField_00680ac0;
  local_50.m_ = (this->map_).elements_;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::SearchFrom(&local_50,(local_50.m_)->index_of_first_non_null_);
  local_38.bucket_index_ = local_50.bucket_index_;
  local_38.node_ = local_50.node_;
  local_38.m_ = local_50.m_;
  while (local_38.node_ != (Node *)0x0) {
    MapValueRef::DeleteData(&(((local_38.node_)->kv).v_)->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&local_38);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(&this->map_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::~Map(&this->map_);
  MapFieldBase::~MapFieldBase((MapFieldBase *)this);
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map_.begin();
       iter != map_.end(); ++iter) {
    iter->second.DeleteData();
  }
  map_.clear();
}